

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints.cpp
# Opt level: O0

int Am_Fill_To_Rest_Of_Height_proc(Am_Object *self)

{
  bool bVar1;
  unsigned_short uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Am_Value *pAVar8;
  Am_Object local_40;
  Am_Object part;
  int height;
  undefined1 local_28 [8];
  Am_Value_List parts;
  Am_Object owner;
  Am_Object *self_local;
  
  Am_Object::Get_Owner((Am_Object *)&parts.item,(Am_Slot_Flags)self);
  pAVar8 = Am_Object::Get((Am_Object *)&parts.item,0x82,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_28,pAVar8);
  part.data._0_4_ = 0;
  Am_Object::Am_Object(&local_40);
  Am_Value_List::Start((Am_Value_List *)local_28);
  while (bVar1 = Am_Value_List::Last((Am_Value_List *)local_28), ((bVar1 ^ 0xffU) & 1) != 0) {
    pAVar8 = Am_Value_List::Get((Am_Value_List *)local_28);
    Am_Object::operator=(&local_40,pAVar8);
    bVar1 = Am_Object::operator!=(&local_40,self);
    if (bVar1) {
      pAVar8 = Am_Object::Get(&local_40,0x67,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar8);
      part.data._0_4_ = iVar3 + (int)part.data;
    }
    Am_Value_List::Next((Am_Value_List *)local_28);
  }
  pAVar8 = Am_Object::Get((Am_Object *)&parts.item,0x67,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar8);
  iVar3 = (int)part.data;
  pAVar8 = Am_Object::Get((Am_Object *)&parts.item,0x9f,0);
  iVar5 = Am_Value::operator_cast_to_int(pAVar8);
  pAVar8 = Am_Object::Get((Am_Object *)&parts.item,0xa1,0);
  iVar6 = Am_Value::operator_cast_to_int(pAVar8);
  pAVar8 = Am_Object::Get((Am_Object *)&parts.item,0x96,0);
  iVar7 = Am_Value::operator_cast_to_int(pAVar8);
  uVar2 = Am_Value_List::Length((Am_Value_List *)local_28);
  Am_Object::~Am_Object(&local_40);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_28);
  Am_Object::~Am_Object((Am_Object *)&parts.item);
  return iVar4 - (iVar3 + iVar5 + iVar6 + iVar7 * (uVar2 - 1));
}

Assistant:

Am_Define_Formula(int, Am_Fill_To_Rest_Of_Height)
{
  Am_Object owner = self.Get_Owner();
  Am_Value_List parts = owner.Get(Am_GRAPHICAL_PARTS);
  int height = 0;
  Am_Object part;
  for (parts.Start(); !parts.Last(); parts.Next()) {
    part = parts.Get();
    if (part != self)
      height += (int)part.Get(Am_HEIGHT);
  }
  return (int)owner.Get(Am_HEIGHT) -
         (height + (int)owner.Get(Am_TOP_OFFSET) +
          (int)owner.Get(Am_BOTTOM_OFFSET) +
          (int)owner.Get(Am_V_SPACING) * (parts.Length() - 1));
}